

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_channel.cc
# Opt level: O3

void __thiscall
assembler::VirtualChannel::process
          (VirtualChannel *this,
          unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_> *tpdu,
          vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
          *out)

{
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *this_00;
  _Rb_tree_header *p_Var1;
  TransportPDU *pTVar2;
  byte *pbVar3;
  long lVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  uint *puVar8;
  ostream *poVar9;
  mapped_type_conflict1 *pmVar10;
  SessionPDU *pSVar11;
  _Base_ptr p_Var12;
  runtime_error *this_01;
  _Base_ptr p_Var13;
  uint apid;
  uint b;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  int *in_R9;
  pointer *__ptr;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
  pVar15;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_std::_Rb_tree_iterator<std::pair<const_int,_int>_>_>
  pVar16;
  _Head_base<0UL,_assembler::SessionPDU_*,_false> local_90;
  _Head_base<0UL,_assembler::SessionPDU_*,_false> local_88;
  undefined1 local_80 [8];
  _Head_base<0UL,_assembler::SessionPDU_*,_false> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  ostream *local_60;
  __uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> local_58;
  __uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> local_50;
  __uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> local_48;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  *local_40;
  ulong local_38;
  
  pTVar2 = (tpdu->_M_t).
           super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
           .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
  pbVar3 = *(byte **)&(pTVar2->header).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  apid = (uint)pbVar3[1] | (*pbVar3 & 7) << 8;
  if (apid == 0x7ff) {
    return;
  }
  local_40 = out;
  bVar6 = TransportPDU::verifyCRC(pTVar2);
  local_80._0_4_ = apid;
  if (bVar6) {
    lVar4 = *(long *)&(((tpdu->_M_t).
                        super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
                        .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl)->
                      header).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
    b = (uint)*(byte *)(lVar4 + 3) | (*(byte *)(lVar4 + 2) & 0x3f) << 8;
    this_00 = &this->apidSeq_;
    p_Var12 = (this->apidSeq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var12 != (_Base_ptr)0x0) {
      p_Var1 = &(this->apidSeq_)._M_t._M_impl.super__Rb_tree_header;
      p_Var13 = &p_Var1->_M_header;
      do {
        if ((int)apid <= (int)p_Var12[1]._M_color) {
          p_Var13 = p_Var12;
        }
        p_Var12 = (&p_Var12->_M_left)[(int)p_Var12[1]._M_color < (int)apid];
      } while (p_Var12 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var13 != p_Var1) && ((int)p_Var13[1]._M_color <= (int)apid)) {
        puVar8 = (uint *)std::
                         map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         ::operator[](this_00,(key_type *)local_80);
        iVar7 = diffWithWrap<16384u>(*puVar8,b);
        if (1 < iVar7) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
          local_60 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
          std::__ostream_insert<char,std::char_traits<char>>(local_60,": Detected TP_PDU drop",0x16)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(local_60," (skipped ",10);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_60,iVar7 + -1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," packet(s)",10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," on APID ",9);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; prev: ",8);
          local_80._0_4_ = apid;
          pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](this_00,(key_type *)local_80);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,*pmVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", packet: ",10);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
        }
      }
    }
    local_80._0_4_ = apid;
    puVar8 = (uint *)std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[](this_00,(key_type *)local_80);
    *puVar8 = b;
    pTVar2 = (tpdu->_M_t).
             super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
             ._M_t.
             super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
             .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
    bVar5 = *(byte *)(*(long *)&(pTVar2->header).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> +
                     2) >> 6;
    if ((bVar5 | 2) == 3) {
      local_60 = (ostream *)&this->apidSessionPDU_;
      p_Var12 = (this->apidSessionPDU_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var12 != (_Base_ptr)0x0) {
        p_Var1 = &(this->apidSessionPDU_)._M_t._M_impl.super__Rb_tree_header;
        p_Var13 = &p_Var1->_M_header;
        do {
          if ((int)apid <= (int)p_Var12[1]._M_color) {
            p_Var13 = p_Var12;
          }
          p_Var12 = (&p_Var12->_M_left)[(int)p_Var12[1]._M_color < (int)apid];
        } while (p_Var12 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var13 != p_Var1) && ((int)p_Var13[1]._M_color <= (int)apid)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,": New S_PDU for ",0x10);
          local_38 = (ulong)apid;
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,", but didn\'t finish previous one",0x20);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          bVar6 = SessionPDU::finish((SessionPDU *)p_Var13[1]._M_parent);
          if (bVar6) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,": Finished S_PDU for APID ",0x1a);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," (",2);
            SessionPDU::getName_abi_cxx11_((string *)local_80,(SessionPDU *)p_Var13[1]._M_parent);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,(char *)CONCAT44(local_80._4_4_,local_80._0_4_),
                                (long)local_78._M_head_impl);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_80._4_4_,local_80._0_4_);
            if (paVar14 != &local_70) {
              operator_delete(paVar14,local_70._M_allocated_capacity + 1);
            }
            local_48._M_t.
            super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
            .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl =
                 (tuple<assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
                 p_Var13[1]._M_parent;
            p_Var13[1]._M_parent = (_Base_ptr)0x0;
            finish((VirtualChannel *)paVar14,
                   (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *
                   )&local_48,local_40);
            if ((_Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                 )local_48._M_t.
                  super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                  .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl !=
                (SessionPDU *)0x0) {
              std::default_delete<assembler::SessionPDU>::operator()
                        ((default_delete<assembler::SessionPDU> *)&local_48,
                         (SessionPDU *)
                         local_48._M_t.
                         super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                         .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl);
            }
            local_48._M_t.
            super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
            .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl =
                 (tuple<assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
                 (_Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                  )0x0;
          }
          poVar9 = local_60;
          local_80._0_4_ = apid;
          pVar15 = std::
                   _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                   ::equal_range((_Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                                  *)local_60,(key_type *)local_80);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
          ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                          *)poVar9,(_Base_ptr)pVar15.first._M_node,(_Base_ptr)pVar15.second._M_node)
          ;
        }
      }
      pSVar11 = (SessionPDU *)operator_new(0xb0);
      SessionPDU::SessionPDU(pSVar11,this->id_,apid);
      local_90._M_head_impl = pSVar11;
      bVar6 = SessionPDU::append(pSVar11,(tpdu->_M_t).
                                         super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
                                         .super__Head_base<0UL,_assembler::TransportPDU_*,_false>.
                                         _M_head_impl);
      if (bVar6) {
        if (bVar5 == 3) {
          if (((local_90._M_head_impl)->buf_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              ((local_90._M_head_impl)->buf_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,": Zero length S_PDU for APID ",0x1d);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            std::endl<char,std::char_traits<char>>(poVar9);
          }
          else {
            local_88._M_head_impl = local_90._M_head_impl;
            local_90._M_head_impl = (SessionPDU *)0x0;
            finish((VirtualChannel *)pSVar11,
                   (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *
                   )&local_88,local_40);
            if (local_88._M_head_impl != (SessionPDU *)0x0) {
              std::default_delete<assembler::SessionPDU>::operator()
                        ((default_delete<assembler::SessionPDU> *)&local_88,local_88._M_head_impl);
            }
            local_88._M_head_impl = (SessionPDU *)0x0;
          }
        }
        else {
          local_78._M_head_impl = local_90._M_head_impl;
          local_90._M_head_impl = (SessionPDU *)0x0;
          local_80._0_4_ = apid;
          std::
          _Rb_tree<int,std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>>
          ::
          _M_emplace_unique<std::pair<unsigned_int,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>
                    ((_Rb_tree<int,std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>>
                      *)local_60,
                     (pair<unsigned_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>
                      *)local_80);
          if (local_78._M_head_impl != (SessionPDU *)0x0) {
            std::default_delete<assembler::SessionPDU>::operator()
                      ((default_delete<assembler::SessionPDU> *)&local_78,local_78._M_head_impl);
          }
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,": Invalid first S_PDU for APID ",0x1f);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      if (local_90._M_head_impl == (SessionPDU *)0x0) {
        return;
      }
      std::default_delete<assembler::SessionPDU>::operator()
                ((default_delete<assembler::SessionPDU> *)&local_90,local_90._M_head_impl);
      return;
    }
    if ((bVar5 & 1) != 0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_90._M_head_impl._0_4_ = 0xe1;
      util::str<char[46],char[103],char[2],int>
                ((string *)local_80,(util *)"Assertion `flag == 0 || flag == 2` failed at ",
                 (char (*) [46])
                 "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/assembler/virtual_channel.cc"
                 ,(char (*) [103])0x1afe61,(char (*) [2])&local_90,in_R9);
      std::runtime_error::runtime_error(this_01,(string *)local_80);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    p_Var12 = (this->apidSessionPDU_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var12 == (_Base_ptr)0x0) {
      return;
    }
    p_Var1 = &(this->apidSessionPDU_)._M_t._M_impl.super__Rb_tree_header;
    p_Var13 = &p_Var1->_M_header;
    do {
      if ((int)apid <= (int)p_Var12[1]._M_color) {
        p_Var13 = p_Var12;
      }
      p_Var12 = (&p_Var12->_M_left)[(int)p_Var12[1]._M_color < (int)apid];
    } while (p_Var12 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var13 == p_Var1) {
      return;
    }
    if ((int)apid < (int)p_Var13[1]._M_color) {
      return;
    }
    pSVar11 = (SessionPDU *)p_Var13[1]._M_parent;
    bVar6 = SessionPDU::append(pSVar11,pTVar2);
    if (bVar6) {
      if (bVar5 != 2) {
        return;
      }
      local_58._M_t.
      super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>.
      super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl =
           (tuple<assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
           p_Var13[1]._M_parent;
      p_Var13[1]._M_parent = (_Base_ptr)0x0;
      finish((VirtualChannel *)pSVar11,
             (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
             &local_58,local_40);
      if ((_Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
          local_58._M_t.
          super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
          .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl != (SessionPDU *)0x0)
      {
        std::default_delete<assembler::SessionPDU>::operator()
                  ((default_delete<assembler::SessionPDU> *)&local_58,
                   (SessionPDU *)
                   local_58._M_t.
                   super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                   .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl);
      }
      local_58._M_t.
      super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>.
      super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl =
           (tuple<assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
           (_Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
           0x0;
      local_80._0_4_ = apid;
      std::
      map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
      ::erase(&this->apidSessionPDU_,(key_type *)local_80);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,": Unable to append to S_PDU on APID ",0x24);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    bVar6 = SessionPDU::finish((SessionPDU *)p_Var13[1]._M_parent);
    if (bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,": Finished S_PDU for APID ",0x1a);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," (",2);
      SessionPDU::getName_abi_cxx11_((string *)local_80,(SessionPDU *)p_Var13[1]._M_parent);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)CONCAT44(local_80._4_4_,local_80._0_4_),
                          (long)local_78._M_head_impl);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
      std::endl<char,std::char_traits<char>>(poVar9);
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_80._4_4_,local_80._0_4_);
      if (paVar14 != &local_70) {
        operator_delete(paVar14,local_70._M_allocated_capacity + 1);
      }
      local_50._M_t.
      super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>.
      super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl =
           (tuple<assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
           p_Var13[1]._M_parent;
      p_Var13[1]._M_parent = (_Base_ptr)0x0;
      finish((VirtualChannel *)paVar14,
             (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
             &local_50,local_40);
      if ((_Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
          local_50._M_t.
          super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
          .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl != (SessionPDU *)0x0)
      {
        std::default_delete<assembler::SessionPDU>::operator()
                  ((default_delete<assembler::SessionPDU> *)&local_50,
                   (SessionPDU *)
                   local_50._M_t.
                   super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                   .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl);
      }
      local_50._M_t.
      super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>.
      super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl =
           (tuple<assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
           (_Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
           0x0;
    }
    local_80._0_4_ = apid;
    pVar15 = std::
             _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
             ::equal_range(&(this->apidSessionPDU_)._M_t,(key_type *)local_80);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,": CRC failure; dropping TP_PDU (APID ",0x25);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    pVar16 = std::
             _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::equal_range(&(this->apidSeq_)._M_t,(key_type *)local_80);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::_M_erase_aux(&(this->apidSeq_)._M_t,(_Base_ptr)pVar16.first._M_node,
                   (_Base_ptr)pVar16.second._M_node);
    local_80._0_4_ = apid;
    pVar15 = std::
             _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
             ::equal_range(&(this->apidSessionPDU_)._M_t,(key_type *)local_80);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
  ::_M_erase_aux(&(this->apidSessionPDU_)._M_t,(_Base_ptr)pVar15.first._M_node,
                 (_Base_ptr)pVar15.second._M_node);
  return;
}

Assistant:

void VirtualChannel::process(
    std::unique_ptr<TransportPDU> tpdu,
    std::vector<std::unique_ptr<SessionPDU>>& out) {
  auto apid = tpdu->apid();

  // Ignore fill packets
  if (apid == 2047) {
    return;
  }

  // Verify CRC is correct
  if (!tpdu->verifyCRC()) {
    std::cerr
      << "VC "
      << id_
      << ": CRC failure; dropping TP_PDU (APID " << apid << ")"
      << std::endl;

    // Clear state for this APID.
    apidSeq_.erase(apid);
    apidSessionPDU_.erase(apid);
    return;
  }

  // The sequence counter is described as (section 6.2.1):
  //
  // > 14-bit packet sequence count, straight sequential count (modulo
  // > 16384) that numbers each source packet generated per APID.
  //
  // Sanity check on this counter to protect against drops.
  //
  auto seq = tpdu->sequenceCount();
  if (apidSeq_.count(apid) > 0) {
    auto skip = diffWithWrap<16384>(apidSeq_[apid], seq) - 1;
    if (skip > 0) {
      std::cerr
        << "VC "
        << id_
        << ": Detected TP_PDU drop"
        << " (skipped " << skip << " packet(s)"
        << " on APID " << apid
        << "; prev: " << apidSeq_[apid]
        << ", packet: " << seq
        << ")"
        << std::endl;
    }
  }
  apidSeq_[apid] = seq;

  // Sequence Flag:
  // - Set to 3 if the user data contains one user data file entirely;
  // - Set to 1 if the user data contains the first segment of one user
  //   data file extending through subsequent packets;
  // - Set to 0 if the user data contains a continuation segment of one
  //   user data file still extending through subsequent packets;
  // - Set to 2 if the user data contains the last segment of a user data
  //   file beginning in an earlier packet.
  auto flag = tpdu->sequenceFlag();
  if (flag == 3 || flag == 1) {
    auto it = apidSessionPDU_.find(apid);
    if (it != apidSessionPDU_.end()) {
      std::cerr
        << "VC "
        << id_
        << ": New S_PDU for "
        << apid
        << ", but didn't finish previous one"
        << std::endl;

      // Try to finish pending S_PDU
      auto& spdu = it->second;
      if (spdu->finish()) {
        std::cerr
          << "VC "
          << id_
          << ": Finished S_PDU for APID "
          << apid
          << " (" << spdu->getName() << ")"
          << std::endl;
        finish(std::move(spdu), out);
      }

      // Erase pending S_PDU as it won't be finished now
      apidSessionPDU_.erase(apid);
    }

    auto spdu = std::make_unique<SessionPDU>(id_, apid);
    if (!spdu->append(*tpdu)) {
      std::cerr
        << "VC "
        << id_
        << ": Invalid first S_PDU for APID "
        << apid
        << std::endl;
    } else {
      // Check if this S_PDU is contained in a single TP_PDU
      if (flag == 3) {
        if (spdu->size() == 0) {
          std::cerr
            << "VC "
            << id_
            << ": Zero length S_PDU for APID "
            << apid
            << std::endl;
        } else {
          finish(std::move(spdu), out);
        }
      } else {
        // Expecting subsequent TP_PDUs to fill this S_PDU
        apidSessionPDU_.insert(std::make_pair(apid, std::move(spdu)));
      }
    }
  } else {
    ASSERT(flag == 0 || flag == 2);

    auto it = apidSessionPDU_.find(apid);
    if (it == apidSessionPDU_.end()) {
      // This is not a valid continuation
      if (false) {
        std::cerr
          << "VC "
          << id_
          << ": Expected to have part of S_PDU for APID "
          << apid
          << std::endl;
      }
    } else {
      // Append data from TP_PDU to S_PDU
      auto& spdu = it->second;
      if (!spdu->append(*tpdu)) {
        std::cerr
          << "VC "
          << id_
          << ": Unable to append to S_PDU on APID "
          << apid
          << std::endl;

        // Unable to append; perhaps this continuation belongs
        // to the next S_PDU on this APID and everything in between
        // was dropped. Try to finish at least the previous S_PDU.
        if (spdu->finish()) {
          std::cerr
            << "VC "
            << id_
            << ": Finished S_PDU for APID "
            << apid
            << " (" << spdu->getName() << ")"
            << std::endl;
          finish(std::move(spdu), out);
        }

        // Erase S_PDU regardless if it was finished or not
        apidSessionPDU_.erase(apid);
      } else {
        // Successfully appended TP_PDU to S_PDU
        if (flag == 2) {
          finish(std::move(spdu), out);
          apidSessionPDU_.erase(apid);
        }
      }
    }
  }
}